

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::StaticAssertTask::~StaticAssertTask(StaticAssertTask *this)

{
  SystemSubroutine::~SystemSubroutine(&this->super_SystemSubroutine);
  operator_delete(this,0x38);
  return;
}

Assistant:

StaticAssertTask() : SystemSubroutine("$static_assert", SubroutineKind::Task) {}